

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.cpp
# Opt level: O0

bool __thiscall
xercesc_4_0::TraverseSchema::isSubstitutionGroupValid
          (TraverseSchema *this,DOMElement *elem,SchemaElementDecl *subsElemDecl,
          ComplexTypeInfo *typeInfo,DatatypeValidator *validator,XMLCh *elemName,bool toEmit)

{
  bool bVar1;
  ModelTypes MVar2;
  uint uVar3;
  uint uVar4;
  ComplexTypeInfo *pCVar5;
  DatatypeValidator *pDVar6;
  DatatypeValidator *pDVar7;
  XMLCh *text2;
  DatatypeValidator *subsValidator_1;
  ComplexTypeInfo *elemTypeInfo;
  DatatypeValidator *subsValidator;
  DatatypeValidator *elemDV;
  int derivationMethod;
  ComplexTypeInfo *subsTypeInfo;
  bool subsRestricted;
  bool toEmit_local;
  XMLCh *elemName_local;
  DatatypeValidator *validator_local;
  ComplexTypeInfo *typeInfo_local;
  SchemaElementDecl *subsElemDecl_local;
  DOMElement *elem_local;
  TraverseSchema *this_local;
  
  bVar1 = false;
  MVar2 = SchemaElementDecl::getModelType(subsElemDecl);
  if (MVar2 == Any) {
    uVar3 = SchemaElementDecl::getFinalSet(subsElemDecl);
    if (((uVar3 & 4) == 0) ||
       ((typeInfo == (ComplexTypeInfo *)0x0 && (validator == (DatatypeValidator *)0x0)))) {
      return true;
    }
    bVar1 = true;
  }
  else if (typeInfo == (ComplexTypeInfo *)0x0) {
    if (validator == (DatatypeValidator *)0x0) {
      return true;
    }
    pCVar5 = SchemaElementDecl::getComplexTypeInfo(subsElemDecl);
    if (pCVar5 == (ComplexTypeInfo *)0x0) {
      pDVar6 = SchemaElementDecl::getDatatypeValidator(subsElemDecl);
      if (pDVar6 == validator) {
        return true;
      }
      if (((pDVar6 != (DatatypeValidator *)0x0) &&
          (uVar3 = (*(pDVar6->super_XSerializable)._vptr_XSerializable[9])(pDVar6,validator),
          (uVar3 & 1) != 0)) &&
         (uVar3 = SchemaElementDecl::getFinalSet(subsElemDecl), (uVar3 & 4) == 0)) {
        return true;
      }
    }
  }
  else {
    pCVar5 = SchemaElementDecl::getComplexTypeInfo(subsElemDecl);
    if (pCVar5 == typeInfo) {
      return true;
    }
    uVar3 = ComplexTypeInfo::getDerivedBy(typeInfo);
    subsValidator_1 = (DatatypeValidator *)typeInfo;
    if (pCVar5 == (ComplexTypeInfo *)0x0) {
      pDVar6 = ComplexTypeInfo::getDatatypeValidator(typeInfo);
      pDVar7 = SchemaElementDecl::getDatatypeValidator(subsElemDecl);
      if (pDVar6 == pDVar7) {
        return true;
      }
      if ((pDVar7 != (DatatypeValidator *)0x0) &&
         (uVar4 = (*(pDVar7->super_XSerializable)._vptr_XSerializable[9])(pDVar7,pDVar6),
         (uVar4 & 1) != 0)) {
        uVar4 = SchemaElementDecl::getFinalSet(subsElemDecl);
        if ((uVar4 & uVar3) == 0) {
          return true;
        }
        bVar1 = true;
      }
    }
    else {
      for (; subsValidator_1 != (DatatypeValidator *)0x0 &&
             (ComplexTypeInfo *)subsValidator_1 != pCVar5;
          subsValidator_1 =
               (DatatypeValidator *)
               ComplexTypeInfo::getBaseComplexTypeInfo((ComplexTypeInfo *)subsValidator_1)) {
      }
      if (subsValidator_1 != (DatatypeValidator *)0x0) {
        uVar4 = SchemaElementDecl::getFinalSet(subsElemDecl);
        if ((uVar4 & uVar3) == 0) {
          return true;
        }
        bVar1 = true;
      }
    }
  }
  if (toEmit) {
    if (bVar1) {
      text2 = XMLElementDecl::getBaseName(&subsElemDecl->super_XMLElementDecl);
      reportSchemaError(this,elem,(XMLCh *)XMLUni::fgXMLErrDomain,0x41,elemName,text2,(XMLCh *)0x0,
                        (XMLCh *)0x0);
    }
    else {
      reportSchemaError(this,elem,(XMLCh *)XMLUni::fgXMLErrDomain,0x42,elemName,(XMLCh *)0x0,
                        (XMLCh *)0x0,(XMLCh *)0x0);
    }
  }
  return false;
}

Assistant:

bool
TraverseSchema::isSubstitutionGroupValid(const DOMElement* const elem,
                                         const SchemaElementDecl* const subsElemDecl,
                                         const ComplexTypeInfo* const typeInfo,
                                         const DatatypeValidator* const validator,
                                         const XMLCh* const elemName,
                                         const bool toEmit) {

    // here we must do two things:
    // 1.  Make sure there actually *is* a relation between the types of
    // the element being nominated and the element doing the nominating;
    // (see PR 3.3.6 point #3 in the first tableau, for instance; this
    // and the corresponding tableaux from 3.4.6 and 3.14.6 rule out the nominated
    // element having an anonymous type declaration.
    // 2.  Make sure the nominated element allows itself to be nominated by
    // an element with the given type-relation.
    // Note:  we assume that (complex|simple)Type processing checks
    // whether the type in question allows itself to
    // be modified as this element desires.

    // if substitution element has any as content model type, return true
    bool subsRestricted = false;
    if (subsElemDecl->getModelType() == SchemaElementDecl::Any) {

        if ((subsElemDecl->getFinalSet() & SchemaSymbols::XSD_RESTRICTION) == 0
            || (typeInfo == 0 && validator == 0))
            return true;
        else
            subsRestricted = true;
    }
    // Check for type relationship;
    // that is, make sure that the type we're deriving has some relatoinship
    // to substitutionGroupElt's type.
    else if (typeInfo) { // do complexType case ...need testing

        ComplexTypeInfo* subsTypeInfo = subsElemDecl->getComplexTypeInfo();

        if (subsTypeInfo == typeInfo)
            return true;

        int derivationMethod = typeInfo->getDerivedBy();

        if (subsTypeInfo == 0) {  // take care of complexType based on simpleType case...

            DatatypeValidator* elemDV = typeInfo->getDatatypeValidator();
            DatatypeValidator* subsValidator = subsElemDecl->getDatatypeValidator();

            if (elemDV == subsValidator) {
                return true;
            }
            else if (subsValidator && subsValidator->isSubstitutableBy(elemDV)) {
                if ((subsElemDecl->getFinalSet() & derivationMethod) == 0) {
                    return true;
                }
                else {
                    subsRestricted = true;
                }
            }
        }
        else { // complex content

            const ComplexTypeInfo* elemTypeInfo = typeInfo;

            for (; elemTypeInfo && elemTypeInfo != subsTypeInfo;
                elemTypeInfo = elemTypeInfo->getBaseComplexTypeInfo()) {
            }

            if (elemTypeInfo) {
                if ((subsElemDecl->getFinalSet() & derivationMethod) == 0) {
                    return true;
                }
                else {
                    subsRestricted = true;
                }
            }
        }
    }
    else if (validator) { // do simpleType case...

        if (!subsElemDecl->getComplexTypeInfo()) {
            // first, check for type relation.
            DatatypeValidator* subsValidator = subsElemDecl->getDatatypeValidator();

            if (subsValidator == validator) {
                return true;
            }
            else if (subsValidator && subsValidator->isSubstitutableBy(validator)
                && ((subsElemDecl->getFinalSet() & SchemaSymbols::XSD_RESTRICTION) == 0)) {
                return true;
            }
        }
    }
    else // validator==0 && typeInfo==0 -- no checking
        return true;

    if (toEmit) {
        if (subsRestricted) {
            reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::InvalidSubstitutionGroupElement,
                              elemName, subsElemDecl->getBaseName());
        }
        else {
            reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::SubstitutionGroupTypeMismatch, elemName);
        }
    }

    return false;
}